

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cpp
# Opt level: O1

int cppcms::b64url::decoded_size(size_t s)

{
  switch((uint)s & 3) {
  case 0:
    return (int)(s >> 2) * 3;
  case 1:
    return -1;
  case 2:
    return (int)(s >> 2) * 3 + 1;
  case 3:
    return (int)(s >> 2) * 3 + 2;
  }
}

Assistant:

int decoded_size(size_t s)
{
	switch(s % 4) {
	case 1: return -1; // invalid
	case 2: return s/4*3+1;
	case 3: return s/4*3+2;
	default:
		return s/4*3;
	}
}